

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_compare.cpp
# Opt level: O0

void __thiscall ktx::PrintDiff::operator<<(PrintDiff *this,DiffImage *diff)

{
  format_args args;
  bool bVar1;
  undefined1 uVar2;
  ptrdiff_t pVar3;
  ptrdiff_t pVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  long in_RSI;
  v10 *this_00;
  char **in_RDI;
  anon_union_16_4_ea85571f_for_vec<4,_unsigned_int,_(glm::precision)0>_3 aVar5;
  anon_union_16_4_ea85571f_for_vec<4,_unsigned_int,_(glm::precision)0>_3 aVar6;
  bool in_stack_00000057;
  TexelBlockPtr<unsigned_char_*> *in_stack_00000058;
  anon_class_8_1_a8a2e026 *in_stack_00000060;
  ptrdiff_t imageByteOffset_1;
  uvec4 pixelCoords_1;
  string comma;
  pair<ImageSpan::TexelBlockPtr<unsigned_char_*>,_ImageSpan::TexelBlockPtr<unsigned_char_*>_>
  *texelBlockPair_1;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  TexelBlockPairList *__range3_1;
  bool first;
  anon_class_8_1_8991fb9c printDiff;
  ptrdiff_t imageByteOffset;
  uvec4 pixelCoords;
  pair<ImageSpan::TexelBlockPtr<unsigned_char_*>,_ImageSpan::TexelBlockPtr<unsigned_char_*>_>
  *texelBlockPair;
  const_iterator __end3;
  const_iterator __begin3;
  TexelBlockPairList *__range3;
  anon_class_8_1_a8a2e026 formatChannels;
  anon_class_8_1_a8a2e026 formatPacked;
  anon_class_1_0_00000001 formatOptionalFileOffset;
  char *nl;
  char *space;
  vector<std::pair<ImageSpan::TexelBlockPtr<unsigned_char_*>,_ImageSpan::TexelBlockPtr<unsigned_char_*>_>,_std::allocator<std::pair<ImageSpan::TexelBlockPtr<unsigned_char_*>,_ImageSpan::TexelBlockPtr<unsigned_char_*>_>_>_>
  *in_stack_fffffffffffffb88;
  TexelBlockPtr<unsigned_char_*> *in_stack_fffffffffffffb90;
  TexelBlockPtr<unsigned_char_*> *this_01;
  vector<std::pair<ImageSpan::TexelBlockPtr<unsigned_char_*>,_ImageSpan::TexelBlockPtr<unsigned_char_*>_>,_std::allocator<std::pair<ImageSpan::TexelBlockPtr<unsigned_char_*>,_ImageSpan::TexelBlockPtr<unsigned_char_*>_>_>_>
  *in_stack_fffffffffffffba0;
  string *in_stack_fffffffffffffba8;
  PrintDiff *in_stack_fffffffffffffbb0;
  char *in_stack_fffffffffffffbb8;
  allocator<char> *in_stack_fffffffffffffbc0;
  char *in_stack_fffffffffffffbc8;
  undefined7 in_stack_fffffffffffffbd0;
  undefined1 in_stack_fffffffffffffbd7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbe0;
  optional<unsigned_long> *in_stack_fffffffffffffbe8;
  int iVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbf0;
  undefined8 in_stack_fffffffffffffbf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc00;
  undefined7 in_stack_fffffffffffffc08;
  undefined4 in_stack_fffffffffffffc60;
  undefined4 in_stack_fffffffffffffc64;
  undefined4 in_stack_fffffffffffffc80;
  undefined4 in_stack_fffffffffffffc84;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc88;
  char **in_stack_fffffffffffffc98;
  char **in_stack_fffffffffffffca0;
  uint *in_stack_fffffffffffffca8;
  char **in_stack_fffffffffffffcb0;
  uint *in_stack_fffffffffffffcb8;
  char **in_stack_fffffffffffffcc0;
  char **in_stack_fffffffffffffcc8;
  string local_328 [32];
  string local_308 [32];
  TexelBlockPtr<unsigned_char_*> local_2e8 [2];
  string local_2c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2a8;
  anon_union_16_4_ea85571f_for_vec<4,_unsigned_int,_(glm::precision)0>_3 local_2a0;
  undefined1 local_290 [8];
  undefined8 local_288;
  pointer local_280 [2];
  byte local_26b;
  allocator<char> local_26a;
  v10 local_269;
  string local_268 [32];
  reference local_248;
  pair<ImageSpan::TexelBlockPtr<unsigned_char_*>,_ImageSpan::TexelBlockPtr<unsigned_char_*>_>
  *local_240;
  __normal_iterator<const_std::pair<ImageSpan::TexelBlockPtr<unsigned_char_*>,_ImageSpan::TexelBlockPtr<unsigned_char_*>_>_*,_std::vector<std::pair<ImageSpan::TexelBlockPtr<unsigned_char_*>,_ImageSpan::TexelBlockPtr<unsigned_char_*>_>,_std::allocator<std::pair<ImageSpan::TexelBlockPtr<unsigned_char_*>,_ImageSpan::TexelBlockPtr<unsigned_char_*>_>_>_>_>
  local_238;
  undefined8 local_230;
  undefined1 local_221;
  string local_220 [23];
  undefined1 in_stack_fffffffffffffdf7;
  TexelBlockPtr<unsigned_char_*> *in_stack_fffffffffffffdf8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_stack_fffffffffffffe00;
  string_view in_stack_fffffffffffffe08;
  string local_1e0 [32];
  string local_1c0 [48];
  string local_190 [32];
  string local_170 [40];
  ptrdiff_t local_148;
  anon_union_16_4_ea85571f_for_vec<4,_unsigned_int,_(glm::precision)0>_3 local_140;
  anon_union_16_4_ea85571f_for_vec<4,_unsigned_int,_(glm::precision)0>_3 local_130;
  reference local_120;
  pair<ImageSpan::TexelBlockPtr<unsigned_char_*>,_ImageSpan::TexelBlockPtr<unsigned_char_*>_>
  *local_118;
  __normal_iterator<const_std::pair<ImageSpan::TexelBlockPtr<unsigned_char_*>,_ImageSpan::TexelBlockPtr<unsigned_char_*>_>_*,_std::vector<std::pair<ImageSpan::TexelBlockPtr<unsigned_char_*>,_ImageSpan::TexelBlockPtr<unsigned_char_*>_>,_std::allocator<std::pair<ImageSpan::TexelBlockPtr<unsigned_char_*>,_ImageSpan::TexelBlockPtr<unsigned_char_*>_>_>_>_>
  local_110;
  undefined8 local_108;
  pointer local_100;
  pointer local_f8;
  undefined1 local_e8 [8];
  undefined1 local_e0 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a8;
  pointer local_a0;
  pointer local_98;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_const_char_*> *local_90
  ;
  pointer local_88;
  pointer pbStack_80;
  string *local_78;
  pointer *local_70;
  pointer local_68;
  pointer pbStack_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  undefined1 *local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  undefined8 local_40;
  undefined1 *local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  char *local_28;
  pointer *local_20;
  char *local_18;
  pointer *local_10;
  char *local_8;
  
  *(undefined1 *)(in_RDI + 0xb) = 1;
  local_100 = (pointer)0x3a2318;
  if (*(int *)(in_RDI + 1) != 2) {
    local_100 = (pointer)0x389019;
  }
  local_e8 = (undefined1  [8])0x3a2318;
  if (*(int *)(in_RDI + 1) != 2) {
    local_e8 = (undefined1  [8])0x387003;
  }
  local_f8 = local_100;
  local_e0._0_8_ = local_100;
  local_e0._8_8_ = in_RSI;
  if (*(int *)(in_RDI + 1) == 0) {
    printContext(in_stack_fffffffffffffbb0);
    PrintIndent::operator()
              ((PrintIndent *)in_stack_fffffffffffffbf0,
               (int)((ulong)in_stack_fffffffffffffbe8 >> 0x20),
               (char (*) [5])in_stack_fffffffffffffbe0,
               (basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffbd8);
    local_108 = *(undefined8 *)(local_e0._8_8_ + 0x20);
    local_110._M_current =
         (pair<ImageSpan::TexelBlockPtr<unsigned_char_*>,_ImageSpan::TexelBlockPtr<unsigned_char_*>_>
          *)std::
            vector<std::pair<ImageSpan::TexelBlockPtr<unsigned_char_*>,_ImageSpan::TexelBlockPtr<unsigned_char_*>_>,_std::allocator<std::pair<ImageSpan::TexelBlockPtr<unsigned_char_*>,_ImageSpan::TexelBlockPtr<unsigned_char_*>_>_>_>
            ::begin(in_stack_fffffffffffffb88);
    local_118 = (pair<ImageSpan::TexelBlockPtr<unsigned_char_*>,_ImageSpan::TexelBlockPtr<unsigned_char_*>_>
                 *)std::
                   vector<std::pair<ImageSpan::TexelBlockPtr<unsigned_char_*>,_ImageSpan::TexelBlockPtr<unsigned_char_*>_>,_std::allocator<std::pair<ImageSpan::TexelBlockPtr<unsigned_char_*>,_ImageSpan::TexelBlockPtr<unsigned_char_*>_>_>_>
                   ::end(in_stack_fffffffffffffb88);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_std::pair<ImageSpan::TexelBlockPtr<unsigned_char_*>,_ImageSpan::TexelBlockPtr<unsigned_char_*>_>_*,_std::vector<std::pair<ImageSpan::TexelBlockPtr<unsigned_char_*>,_ImageSpan::TexelBlockPtr<unsigned_char_*>_>,_std::allocator<std::pair<ImageSpan::TexelBlockPtr<unsigned_char_*>,_ImageSpan::TexelBlockPtr<unsigned_char_*>_>_>_>_>
                               *)in_stack_fffffffffffffb90,
                              (__normal_iterator<const_std::pair<ImageSpan::TexelBlockPtr<unsigned_char_*>,_ImageSpan::TexelBlockPtr<unsigned_char_*>_>_*,_std::vector<std::pair<ImageSpan::TexelBlockPtr<unsigned_char_*>,_ImageSpan::TexelBlockPtr<unsigned_char_*>_>,_std::allocator<std::pair<ImageSpan::TexelBlockPtr<unsigned_char_*>,_ImageSpan::TexelBlockPtr<unsigned_char_*>_>_>_>_>
                               *)in_stack_fffffffffffffb88), bVar1) {
      local_120 = __gnu_cxx::
                  __normal_iterator<const_std::pair<ImageSpan::TexelBlockPtr<unsigned_char_*>,_ImageSpan::TexelBlockPtr<unsigned_char_*>_>_*,_std::vector<std::pair<ImageSpan::TexelBlockPtr<unsigned_char_*>,_ImageSpan::TexelBlockPtr<unsigned_char_*>_>,_std::allocator<std::pair<ImageSpan::TexelBlockPtr<unsigned_char_*>,_ImageSpan::TexelBlockPtr<unsigned_char_*>_>_>_>_>
                  ::operator*(&local_110);
      local_130.field_0 =
           (anon_struct_16_4_d86d922e_for_anon_union_16_4_ea85571f_for_vec<4,_unsigned_int,_(glm::precision)0>_3_0
            )ImageSpan::TexelBlockPtr<unsigned_char_*>::getPixelLocation
                       ((TexelBlockPtr<unsigned_char_*> *)in_stack_fffffffffffffbb0);
      local_140.field_0 =
           (anon_struct_16_4_d86d922e_for_anon_union_16_4_ea85571f_for_vec<4,_unsigned_int,_(glm::precision)0>_3_0
            )ImageSpan::TexelBlockPtr<unsigned_char_*>::getPixelLocation
                       ((TexelBlockPtr<unsigned_char_*> *)in_stack_fffffffffffffbb0);
      bVar1 = glm::operator==((vec<4,_unsigned_int,_(glm::precision)0> *)in_stack_fffffffffffffb90,
                              (vec<4,_unsigned_int,_(glm::precision)0> *)in_stack_fffffffffffffb88);
      if (!bVar1) {
        __assert_fail("pixelCoords == texelBlockPair.second.getPixelLocation()",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_compare.cpp"
                      ,0x2d6,"void ktx::PrintDiff::operator<<(const DiffImage &)");
      }
      PrintIndent::operator()
                ((PrintIndent *)in_stack_fffffffffffffc00,
                 (int)((ulong)in_stack_fffffffffffffbf8 >> 0x20),
                 (char (*) [27])in_stack_fffffffffffffbf0,(uint *)in_stack_fffffffffffffbe8,
                 (uint *)in_stack_fffffffffffffbe0,(uint *)in_stack_fffffffffffffbd8);
      pVar3 = ImageSpan::TexelBlockPtr<unsigned_char_*>::getTexelBlockByteOffset
                        (in_stack_fffffffffffffb90);
      local_148 = pVar3;
      pVar4 = ImageSpan::TexelBlockPtr<unsigned_char_*>::getTexelBlockByteOffset
                        (in_stack_fffffffffffffb90);
      if (pVar3 != pVar4) {
        __assert_fail("imageByteOffset == texelBlockPair.second.getTexelBlockByteOffset()",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_compare.cpp"
                      ,0x2db,"void ktx::PrintDiff::operator<<(const DiffImage &)");
      }
      PrintIndent::operator()
                ((PrintIndent *)in_stack_fffffffffffffbf0,
                 (int)((ulong)in_stack_fffffffffffffbe8 >> 0x20),
                 (char (*) [31])in_stack_fffffffffffffbe0,(long *)in_stack_fffffffffffffbd8);
      TEMPNAMEPLACEHOLDERVALUE(ktx::DiffImage_const&)::
      {lambda(std::optional<unsigned_long>const&,unsigned_long,bool)#1}::operator<<
                ((anon_class_1_0_00000001 *)in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,
                 (size_t)in_stack_fffffffffffffbe0,SUB81((ulong)in_stack_fffffffffffffbd8 >> 0x38,0)
                );
      TEMPNAMEPLACEHOLDERVALUE(ktx::DiffImage_const&)::
      {lambda(std::optional<unsigned_long>const&,unsigned_long,bool)#1}::operator<<
                ((anon_class_1_0_00000001 *)in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,
                 (size_t)in_stack_fffffffffffffbe0,SUB81((ulong)in_stack_fffffffffffffbd8 >> 0x38,0)
                );
      operator<<::anon_class_8_1_8991fb9c::operator()
                ((anon_class_8_1_8991fb9c *)in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,
                 (string *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
      std::__cxx11::string::~string(local_190);
      std::__cxx11::string::~string(local_170);
      TEMPNAMEPLACEHOLDERVALUE(ktx::DiffImage_const&)::
      {lambda(ImageSpan::TexelBlockPtr<unsigned_char*>const&,bool)#1}::operator<<
                ((anon_class_8_1_a8a2e026 *)in_stack_fffffffffffffe00.values_,
                 in_stack_fffffffffffffdf8,(bool)in_stack_fffffffffffffdf7);
      TEMPNAMEPLACEHOLDERVALUE(ktx::DiffImage_const&)::
      {lambda(ImageSpan::TexelBlockPtr<unsigned_char*>const&,bool)#1}::operator<<
                ((anon_class_8_1_a8a2e026 *)in_stack_fffffffffffffe00.values_,
                 in_stack_fffffffffffffdf8,(bool)in_stack_fffffffffffffdf7);
      operator<<::anon_class_8_1_8991fb9c::operator()
                ((anon_class_8_1_8991fb9c *)in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,
                 (string *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
      std::__cxx11::string::~string(local_1e0);
      std::__cxx11::string::~string(local_1c0);
      bVar1 = ImageSpan::TexelBlockPtr<unsigned_char_*>::isBlockCompressed
                        ((TexelBlockPtr<unsigned_char_*> *)0x17e647);
      if (!bVar1) {
        TEMPNAMEPLACEHOLDERVALUE(ktx::DiffImage_const&)::
        {lambda(ImageSpan::TexelBlockPtr<unsigned_char*>const&,bool)#2}::operator<<
                  (in_stack_00000060,in_stack_00000058,in_stack_00000057);
        TEMPNAMEPLACEHOLDERVALUE(ktx::DiffImage_const&)::
        {lambda(ImageSpan::TexelBlockPtr<unsigned_char*>const&,bool)#2}::operator<<
                  (in_stack_00000060,in_stack_00000058,in_stack_00000057);
        operator<<::anon_class_8_1_8991fb9c::operator()
                  ((anon_class_8_1_8991fb9c *)in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,
                   (string *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
        std::__cxx11::string::~string(local_220);
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffe00);
      }
      __gnu_cxx::
      __normal_iterator<const_std::pair<ImageSpan::TexelBlockPtr<unsigned_char_*>,_ImageSpan::TexelBlockPtr<unsigned_char_*>_>_*,_std::vector<std::pair<ImageSpan::TexelBlockPtr<unsigned_char_*>,_ImageSpan::TexelBlockPtr<unsigned_char_*>_>,_std::allocator<std::pair<ImageSpan::TexelBlockPtr<unsigned_char_*>,_ImageSpan::TexelBlockPtr<unsigned_char_*>_>_>_>_>
      ::operator++(&local_110);
    }
  }
  else {
    beginJsonOutput(in_stack_fffffffffffffbb0);
    PrintIndent::operator()
              ((PrintIndent *)in_stack_fffffffffffffbf0,
               (int)((ulong)in_stack_fffffffffffffbe8 >> 0x20),
               (char (*) [9])in_stack_fffffffffffffbe0,
               (basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffbd8,
               (char **)CONCAT17(in_stack_fffffffffffffbd7,in_stack_fffffffffffffbd0));
    local_221 = 1;
    local_230 = *(undefined8 *)(local_e0._8_8_ + 0x20);
    local_238._M_current =
         (pair<ImageSpan::TexelBlockPtr<unsigned_char_*>,_ImageSpan::TexelBlockPtr<unsigned_char_*>_>
          *)std::
            vector<std::pair<ImageSpan::TexelBlockPtr<unsigned_char_*>,_ImageSpan::TexelBlockPtr<unsigned_char_*>_>,_std::allocator<std::pair<ImageSpan::TexelBlockPtr<unsigned_char_*>,_ImageSpan::TexelBlockPtr<unsigned_char_*>_>_>_>
            ::begin(in_stack_fffffffffffffb88);
    local_240 = (pair<ImageSpan::TexelBlockPtr<unsigned_char_*>,_ImageSpan::TexelBlockPtr<unsigned_char_*>_>
                 *)std::
                   vector<std::pair<ImageSpan::TexelBlockPtr<unsigned_char_*>,_ImageSpan::TexelBlockPtr<unsigned_char_*>_>,_std::allocator<std::pair<ImageSpan::TexelBlockPtr<unsigned_char_*>,_ImageSpan::TexelBlockPtr<unsigned_char_*>_>_>_>
                   ::end(in_stack_fffffffffffffb88);
    while( true ) {
      iVar7 = (int)((ulong)in_stack_fffffffffffffbe8 >> 0x20);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_std::pair<ImageSpan::TexelBlockPtr<unsigned_char_*>,_ImageSpan::TexelBlockPtr<unsigned_char_*>_>_*,_std::vector<std::pair<ImageSpan::TexelBlockPtr<unsigned_char_*>,_ImageSpan::TexelBlockPtr<unsigned_char_*>_>,_std::allocator<std::pair<ImageSpan::TexelBlockPtr<unsigned_char_*>,_ImageSpan::TexelBlockPtr<unsigned_char_*>_>_>_>_>
                          *)in_stack_fffffffffffffb90,
                         (__normal_iterator<const_std::pair<ImageSpan::TexelBlockPtr<unsigned_char_*>,_ImageSpan::TexelBlockPtr<unsigned_char_*>_>_*,_std::vector<std::pair<ImageSpan::TexelBlockPtr<unsigned_char_*>,_ImageSpan::TexelBlockPtr<unsigned_char_*>_>,_std::allocator<std::pair<ImageSpan::TexelBlockPtr<unsigned_char_*>,_ImageSpan::TexelBlockPtr<unsigned_char_*>_>_>_>_>
                          *)in_stack_fffffffffffffb88);
      if (!bVar1) break;
      local_248 = __gnu_cxx::
                  __normal_iterator<const_std::pair<ImageSpan::TexelBlockPtr<unsigned_char_*>,_ImageSpan::TexelBlockPtr<unsigned_char_*>_>_*,_std::vector<std::pair<ImageSpan::TexelBlockPtr<unsigned_char_*>,_ImageSpan::TexelBlockPtr<unsigned_char_*>_>,_std::allocator<std::pair<ImageSpan::TexelBlockPtr<unsigned_char_*>,_ImageSpan::TexelBlockPtr<unsigned_char_*>_>_>_>_>
                  ::operator*(&local_238);
      local_269 = (v10)0x0;
      this_00 = &local_269;
      bVar1 = std::exchange<bool,bool>
                        ((bool *)in_stack_fffffffffffffb90,(bool *)in_stack_fffffffffffffb88);
      local_26b = 0;
      if (bVar1) {
        std::allocator<char>::allocator();
        local_26b = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffbd7,in_stack_fffffffffffffbd0),
                   in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0);
      }
      else {
        local_20 = local_280;
        local_28 = ",{}";
        local_18 = ",{}";
        local_280[0] = (pointer)0x38615f;
        local_10 = local_20;
        local_98 = (pointer)std::char_traits<char>::length((char_type *)0x17e96c);
        local_8 = local_28;
        local_78 = local_268;
        local_88 = local_280[0];
        local_90 = (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_const_char_*>
                    *)(local_e8 + 8);
        local_70 = &local_88;
        local_a0 = local_280[0];
        pbStack_80 = local_98;
        local_68 = local_a0;
        pbStack_60 = local_98;
        local_c8._0_8_ =
             ::fmt::v10::
             make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,char_const*const>
                       (local_90,this_00,(char **)local_78);
        local_50 = (undefined1 *)((long)&local_c8.field_2 + 8);
        local_58 = &local_c8;
        local_40 = 0xc;
        local_c8.field_2._M_local_buf[8] = true;
        local_c8.field_2._M_local_buf[9] = false;
        local_c8.field_2._10_6_ = 0;
        args.field_1.values_ = in_stack_fffffffffffffe00.values_;
        args.desc_ = (unsigned_long_long)in_stack_fffffffffffffdf8;
        local_48 = local_58;
        local_38 = local_50;
        local_30 = local_58;
        local_a8 = local_58;
        ::fmt::v10::vformat_abi_cxx11_(in_stack_fffffffffffffe08,args);
      }
      if ((local_26b & 1) != 0) {
        std::allocator<char>::~allocator(&local_26a);
      }
      PrintIndent::operator()
                ((PrintIndent *)in_stack_fffffffffffffbf0,iVar7,
                 (char (*) [5])in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,
                 (char **)CONCAT17(in_stack_fffffffffffffbd7,in_stack_fffffffffffffbd0));
      PrintIndent::operator()
                ((PrintIndent *)in_stack_fffffffffffffbf0,iVar7,
                 (char (*) [5])in_stack_fffffffffffffbe0,(char **)in_stack_fffffffffffffbd8);
      aVar5.field_0 =
           (anon_struct_16_4_d86d922e_for_anon_union_16_4_ea85571f_for_vec<4,_unsigned_int,_(glm::precision)0>_3_0
            )ImageSpan::TexelBlockPtr<unsigned_char_*>::getPixelLocation
                       ((TexelBlockPtr<unsigned_char_*> *)in_stack_fffffffffffffbb0);
      _local_290 = aVar5.field_0;
      aVar6.field_0 =
           (anon_struct_16_4_d86d922e_for_anon_union_16_4_ea85571f_for_vec<4,_unsigned_int,_(glm::precision)0>_3_0
            )ImageSpan::TexelBlockPtr<unsigned_char_*>::getPixelLocation
                       ((TexelBlockPtr<unsigned_char_*> *)in_stack_fffffffffffffbb0);
      local_2a0.field_0 = aVar6.field_0;
      uVar2 = glm::operator==((vec<4,_unsigned_int,_(glm::precision)0> *)in_stack_fffffffffffffb90,
                              (vec<4,_unsigned_int,_(glm::precision)0> *)in_stack_fffffffffffffb88);
      if (!(bool)uVar2) {
        __assert_fail("pixelCoords == texelBlockPair.second.getPixelLocation()",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_compare.cpp"
                      ,0x2fc,"void ktx::PrintDiff::operator<<(const DiffImage &)");
      }
      this_01 = (TexelBlockPtr<unsigned_char_*> *)(local_290 + 4);
      in_stack_fffffffffffffbb0 = (PrintDiff *)local_e8;
      PrintIndent::operator()
                (aVar5._0_8_,aVar5.field_0.w,aVar6._0_8_,aVar6._8_8_,
                 (char **)CONCAT17(uVar2,in_stack_fffffffffffffc08),
                 (uint *)in_stack_fffffffffffffc00,in_stack_fffffffffffffca0,
                 in_stack_fffffffffffffca8,in_stack_fffffffffffffcb0,in_stack_fffffffffffffcb8,
                 in_stack_fffffffffffffcc0,in_stack_fffffffffffffcc8);
      in_stack_fffffffffffffbf0 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ImageSpan::TexelBlockPtr<unsigned_char_*>::getTexelBlockByteOffset(this_01);
      in_stack_fffffffffffffc00 = in_stack_fffffffffffffbf0;
      local_2a8 = in_stack_fffffffffffffbf0;
      args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ImageSpan::TexelBlockPtr<unsigned_char_*>::getTexelBlockByteOffset(this_01);
      if (in_stack_fffffffffffffbf0 != args_1) {
        __assert_fail("imageByteOffset == texelBlockPair.second.getTexelBlockByteOffset()",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_compare.cpp"
                      ,0x302,"void ktx::PrintDiff::operator<<(const DiffImage &)");
      }
      PrintIndent::operator()
                (aVar6._0_8_,aVar6.field_0.w,
                 (char (*) [37])CONCAT17(uVar2,in_stack_fffffffffffffc08),
                 (char **)in_stack_fffffffffffffc00,(char **)args_1,
                 (long *)in_stack_fffffffffffffbf0,
                 (char **)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                 (long *)in_stack_fffffffffffffc88,in_RDI,in_stack_fffffffffffffc98);
      in_stack_fffffffffffffbe8 = (optional<unsigned_long> *)*in_RDI;
      TEMPNAMEPLACEHOLDERVALUE(ktx::DiffImage_const&)::
      {lambda(std::optional<unsigned_long>const&,unsigned_long,bool)#1}::operator<<
                ((anon_class_1_0_00000001 *)in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,
                 (size_t)in_stack_fffffffffffffbe0,SUB81((ulong)in_stack_fffffffffffffbd8 >> 0x38,0)
                );
      TEMPNAMEPLACEHOLDERVALUE(ktx::DiffImage_const&)::
      {lambda(std::optional<unsigned_long>const&,unsigned_long,bool)#1}::operator<<
                ((anon_class_1_0_00000001 *)in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,
                 (size_t)in_stack_fffffffffffffbe0,SUB81((ulong)in_stack_fffffffffffffbd8 >> 0x38,0)
                );
      in_stack_fffffffffffffba0 =
           (vector<std::pair<ImageSpan::TexelBlockPtr<unsigned_char_*>,_ImageSpan::TexelBlockPtr<unsigned_char_*>_>,_std::allocator<std::pair<ImageSpan::TexelBlockPtr<unsigned_char_*>,_ImageSpan::TexelBlockPtr<unsigned_char_*>_>_>_>
            *)local_e8;
      in_stack_fffffffffffffb90 = local_2e8;
      PrintIndent::operator()
                (aVar6._0_8_,aVar6.field_0.w,
                 (char (*) [36])CONCAT17(uVar2,in_stack_fffffffffffffc08),
                 (char **)in_stack_fffffffffffffc00,(char **)args_1,in_stack_fffffffffffffbf0,
                 (char **)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                 in_stack_fffffffffffffc88,in_RDI,in_stack_fffffffffffffc98);
      iVar7 = (int)((ulong)args_1 >> 0x20);
      std::__cxx11::string::~string((string *)local_2e8);
      std::__cxx11::string::~string(local_2c8);
      PrintIndent::operator()
                ((PrintIndent *)in_stack_fffffffffffffbf0,
                 (int)((ulong)in_stack_fffffffffffffbe8 >> 0x20),
                 (char (*) [15])in_stack_fffffffffffffbe0,(char **)in_stack_fffffffffffffbd8,
                 (char **)CONCAT17(in_stack_fffffffffffffbd7,in_stack_fffffffffffffbd0));
      in_stack_fffffffffffffbe0 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*in_RDI;
      TEMPNAMEPLACEHOLDERVALUE(ktx::DiffImage_const&)::
      {lambda(ImageSpan::TexelBlockPtr<unsigned_char*>const&,bool)#1}::operator<<
                ((anon_class_8_1_a8a2e026 *)in_stack_fffffffffffffe00.values_,
                 in_stack_fffffffffffffdf8,(bool)in_stack_fffffffffffffdf7);
      PrintIndent::operator()
                ((PrintIndent *)in_stack_fffffffffffffc00,iVar7,
                 (char (*) [12])in_stack_fffffffffffffbf0,(char **)in_stack_fffffffffffffbe8,
                 in_stack_fffffffffffffbe0,(char **)in_stack_fffffffffffffbd8,
                 (char **)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60));
      std::__cxx11::string::~string(local_308);
      in_stack_fffffffffffffbd8 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*in_RDI;
      TEMPNAMEPLACEHOLDERVALUE(ktx::DiffImage_const&)::
      {lambda(ImageSpan::TexelBlockPtr<unsigned_char*>const&,bool)#1}::operator<<
                ((anon_class_8_1_a8a2e026 *)in_stack_fffffffffffffe00.values_,
                 in_stack_fffffffffffffdf8,(bool)in_stack_fffffffffffffdf7);
      in_stack_fffffffffffffb88 =
           (vector<std::pair<ImageSpan::TexelBlockPtr<unsigned_char_*>,_ImageSpan::TexelBlockPtr<unsigned_char_*>_>,_std::allocator<std::pair<ImageSpan::TexelBlockPtr<unsigned_char_*>,_ImageSpan::TexelBlockPtr<unsigned_char_*>_>_>_>
            *)local_e8;
      PrintIndent::operator()
                ((PrintIndent *)in_stack_fffffffffffffc00,iVar7,
                 (char (*) [11])in_stack_fffffffffffffbf0,(char **)in_stack_fffffffffffffbe8,
                 in_stack_fffffffffffffbe0,(char **)in_stack_fffffffffffffbd8,
                 (char **)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60));
      std::__cxx11::string::~string(local_328);
      PrintIndent::operator()
                ((PrintIndent *)in_stack_fffffffffffffbe0,
                 (int)((ulong)in_stack_fffffffffffffbd8 >> 0x20),
                 (char (*) [2])CONCAT17(in_stack_fffffffffffffbd7,in_stack_fffffffffffffbd0));
      in_stack_fffffffffffffbd7 =
           ImageSpan::TexelBlockPtr<unsigned_char_*>::isBlockCompressed
                     ((TexelBlockPtr<unsigned_char_*> *)0x17efda);
      if (!(bool)in_stack_fffffffffffffbd7) {
        PrintIndent::operator()
                  ((PrintIndent *)in_stack_fffffffffffffbf0,
                   (int)((ulong)in_stack_fffffffffffffbe8 >> 0x20),
                   (char (*) [4])in_stack_fffffffffffffbe0,(char **)in_stack_fffffffffffffbd8);
        PrintIndent::operator()
                  ((PrintIndent *)in_stack_fffffffffffffbf0,
                   (int)((ulong)in_stack_fffffffffffffbe8 >> 0x20),
                   (char (*) [17])in_stack_fffffffffffffbe0,(char **)in_stack_fffffffffffffbd8,
                   (char **)CONCAT17(in_stack_fffffffffffffbd7,in_stack_fffffffffffffbd0));
        in_stack_fffffffffffffbc8 = *in_RDI;
        TEMPNAMEPLACEHOLDERVALUE(ktx::DiffImage_const&)::
        {lambda(ImageSpan::TexelBlockPtr<unsigned_char*>const&,bool)#2}::operator<<
                  (in_stack_00000060,in_stack_00000058,in_stack_00000057);
        PrintIndent::operator()
                  ((PrintIndent *)in_stack_fffffffffffffc00,iVar7,
                   (char (*) [12])in_stack_fffffffffffffbf0,(char **)in_stack_fffffffffffffbe8,
                   in_stack_fffffffffffffbe0,(char **)in_stack_fffffffffffffbd8,
                   (char **)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60));
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffcb8);
        in_stack_fffffffffffffbc0 = (allocator<char> *)*in_RDI;
        TEMPNAMEPLACEHOLDERVALUE(ktx::DiffImage_const&)::
        {lambda(ImageSpan::TexelBlockPtr<unsigned_char*>const&,bool)#2}::operator<<
                  (in_stack_00000060,in_stack_00000058,in_stack_00000057);
        in_stack_fffffffffffffb88 =
             (vector<std::pair<ImageSpan::TexelBlockPtr<unsigned_char_*>,_ImageSpan::TexelBlockPtr<unsigned_char_*>_>,_std::allocator<std::pair<ImageSpan::TexelBlockPtr<unsigned_char_*>,_ImageSpan::TexelBlockPtr<unsigned_char_*>_>_>_>
              *)local_e8;
        PrintIndent::operator()
                  ((PrintIndent *)in_stack_fffffffffffffc00,iVar7,
                   (char (*) [11])in_stack_fffffffffffffbf0,(char **)in_stack_fffffffffffffbe8,
                   in_stack_fffffffffffffbe0,(char **)in_stack_fffffffffffffbd8,
                   (char **)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60));
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffc98);
        PrintIndent::operator()
                  ((PrintIndent *)in_stack_fffffffffffffbe0,
                   (int)((ulong)in_stack_fffffffffffffbd8 >> 0x20),
                   (char (*) [2])CONCAT17(in_stack_fffffffffffffbd7,in_stack_fffffffffffffbd0));
      }
      PrintIndent::operator()
                ((PrintIndent *)in_stack_fffffffffffffbf0,
                 (int)((ulong)in_stack_fffffffffffffbe8 >> 0x20),
                 (char (*) [3])in_stack_fffffffffffffbe0,(char **)in_stack_fffffffffffffbd8);
      PrintIndent::operator()
                ((PrintIndent *)in_stack_fffffffffffffbe0,
                 (int)((ulong)in_stack_fffffffffffffbd8 >> 0x20),
                 (char (*) [3])CONCAT17(in_stack_fffffffffffffbd7,in_stack_fffffffffffffbd0));
      std::__cxx11::string::~string(local_268);
      __gnu_cxx::
      __normal_iterator<const_std::pair<ImageSpan::TexelBlockPtr<unsigned_char_*>,_ImageSpan::TexelBlockPtr<unsigned_char_*>_>_*,_std::vector<std::pair<ImageSpan::TexelBlockPtr<unsigned_char_*>,_ImageSpan::TexelBlockPtr<unsigned_char_*>_>,_std::allocator<std::pair<ImageSpan::TexelBlockPtr<unsigned_char_*>,_ImageSpan::TexelBlockPtr<unsigned_char_*>_>_>_>_>
      ::operator++(&local_238);
    }
    bVar1 = std::
            vector<std::pair<ImageSpan::TexelBlockPtr<unsigned_char_*>,_ImageSpan::TexelBlockPtr<unsigned_char_*>_>,_std::allocator<std::pair<ImageSpan::TexelBlockPtr<unsigned_char_*>,_ImageSpan::TexelBlockPtr<unsigned_char_*>_>_>_>
            ::empty(in_stack_fffffffffffffba0);
    if (bVar1) {
      PrintIndent::operator()
                ((PrintIndent *)in_stack_fffffffffffffbe0,
                 (int)((ulong)in_stack_fffffffffffffbd8 >> 0x20),
                 (char (*) [2])CONCAT17(in_stack_fffffffffffffbd7,in_stack_fffffffffffffbd0));
    }
    else {
      PrintIndent::operator()
                ((PrintIndent *)in_stack_fffffffffffffbf0,iVar7,
                 (char (*) [3])in_stack_fffffffffffffbe0,(char **)in_stack_fffffffffffffbd8);
      PrintIndent::operator()
                ((PrintIndent *)in_stack_fffffffffffffbe0,
                 (int)((ulong)in_stack_fffffffffffffbd8 >> 0x20),
                 (char (*) [2])CONCAT17(in_stack_fffffffffffffbd7,in_stack_fffffffffffffbd0));
    }
  }
  return;
}

Assistant:

void operator<<(const DiffImage& diff) {
        different = true;

        const auto space = outputFormat != OutputFormat::json_mini ?  " " : "";
        const auto nl = outputFormat != OutputFormat::json_mini ?  "\n" : "";

        auto formatOptionalFileOffset = [](const std::optional<std::size_t>& fileOffset, std::size_t imageOffset, bool json) {
            if (fileOffset.has_value())
                return fmt::format(json ? "{}" : "0x{:x}", *fileOffset + imageOffset);
            else
                return fmt::format(json ? "null" : "N/A");
        };

        auto formatPacked = [=](const ImageSpan::TexelBlockPtr<>& texelBlock, bool json) {
            const uint32_t hexDigits = texelBlock.getPackedElementByteSize() << 1;
            const auto quote = json ? "\"" : "";
            std::stringstream formattedValue;
            bool first = true;
            for (uint32_t elementIdx = 0; elementIdx < texelBlock.getPackedElementCount(); ++elementIdx) {
                const uint32_t element = texelBlock.getPackedElement(elementIdx);
                const auto comma = std::exchange(first, false) ? "" : fmt::format(",{}", space);
                fmt::print(formattedValue, "{}{}0x{:0{}x}{}", comma, quote, element, hexDigits, quote);
            }
            return formattedValue.str();
        };

        auto formatChannels = [=](const ImageSpan::TexelBlockPtr<>& texelBlock, bool json) {
            // If decodable channels are not available (e.g. block compressed), then this should not be called
            assert(texelBlock.getChannelCount() != 0);
            const auto quote = json ? "\"" : "";
            std::stringstream formattedValue;
            bool first = true;
            // Prefer to decode to integer (e.g. UNORM will be output as list of integer values instead of float values)
            if (texelBlock.canDecodeUINT()) {
                // Unsigned integer channels
                const glm::uvec4 channels = texelBlock.decodeUINT();
                for (uint32_t channelIdx = 0; channelIdx < texelBlock.getChannelCount(); ++channelIdx) {
                    const auto comma = std::exchange(first, false) ? "" : fmt::format(",{}", space);
                    fmt::print(formattedValue, "{}{}", comma, channels[channelIdx]);
                }
            } else if (texelBlock.canDecodeSINT()) {
                // Signed integer channels
                const glm::ivec4 channels = texelBlock.decodeSINT();
                for (uint32_t channelIdx = 0; channelIdx < texelBlock.getChannelCount(); ++channelIdx) {
                    const auto comma = std::exchange(first, false) ? "" : fmt::format(",{}", space);
                    fmt::print(formattedValue, "{}{}", comma, channels[channelIdx]);
                }
            } else if (texelBlock.canDecodeFLOAT()) {
                // Floating point channels
                const glm::vec4 channels = texelBlock.decodeFLOAT();
                for (uint32_t channelIdx = 0; channelIdx < texelBlock.getChannelCount(); ++channelIdx) {
                    const auto comma = std::exchange(first, false) ? "" : fmt::format(",{}", space);
                    float channel = channels[channelIdx];
                    if (std::isinf(channel)) {
                        // Output signed infinity (optionally quoted)
                        const auto sign = std::signbit(channel) ? "-" : "+";
                        fmt::print(formattedValue, "{}{}{}inf{}", comma, quote, sign, quote);
                    } else if (std::isnan(channel)) {
                        // Output signed not-a-number (optionally quoted)
                        fmt::print(formattedValue, "{}{}nan{}", comma, quote, quote);
                    } else {
                        // Output signed value (explicitly handle sign bit to differentiate between +0.0 and -0.0)
                        // However, we only output sign for negative values because JSON does not allow leading "+"
                        const auto sign = std::signbit(channel) ? "-" : "";
                        fmt::print(formattedValue, "{}{}{}", comma, sign, std::abs(channel));
                    }
                }
            } else {
                // Unexpected format
                assert(false);
                return std::string("");
            }
            return formattedValue.str();
        };

        if (outputFormat == OutputFormat::text) {
            printContext();
            printIndent(0, "+{}\n", diff.textHeader);
            for (const auto& texelBlockPair : diff.texelBlockPairList) {
                const auto pixelCoords = texelBlockPair.first.getPixelLocation();
                // Currently we only compare texel blocks with the same coordinates
                assert(pixelCoords == texelBlockPair.second.getPixelLocation());
                printIndent(0, "  Coordinates: {}, {}, {}\n", pixelCoords.x, pixelCoords.y, pixelCoords.z);

                const auto imageByteOffset = texelBlockPair.first.getTexelBlockByteOffset();
                // Currently we only compare matching formats, hence image byte offsets should match
                assert(imageByteOffset == texelBlockPair.second.getTexelBlockByteOffset());
                printIndent(0, "    Image byte offset: 0x{:x}\n", imageByteOffset);

                auto printDiff = [=](const char* textHeader, const std::string firstValue, const std::string secondValue) {
                    if (firstValue == secondValue) {
                        printIndent(0, "    {}: {}\n", textHeader, firstValue);
                    } else {
                        printIndent(0, "-    {}: {}\n", textHeader, firstValue);
                        printIndent(0, "+    {}: {}\n", textHeader, secondValue);
                    }
                };

                printDiff("File byte offset",
                    formatOptionalFileOffset(diff.fileOffsets[0], imageByteOffset, false),
                    formatOptionalFileOffset(diff.fileOffsets[1], imageByteOffset, false));

                printDiff("Packed", formatPacked(texelBlockPair.first, false), formatPacked(texelBlockPair.second, false));

                // Only output chnalles if not block-compressed
                if (!texelBlockPair.first.isBlockCompressed())
                    printDiff("Channels", formatChannels(texelBlockPair.first, false), formatChannels(texelBlockPair.second, false));
            }
        } else {
            beginJsonOutput();
            printIndent(2, "\"{}\":{}[", diff.fragmentUri, space);
            bool first = true;
            for (const auto& texelBlockPair : diff.texelBlockPairList) {
                const auto comma = std::exchange(first, false) ? "" : fmt::format(",{}", space);
                printIndent(0, "{}{}", comma, nl);
                printIndent(3, "{{{}", nl);

                const auto pixelCoords = texelBlockPair.first.getPixelLocation();
                // Currently we only compare texel blocks with the same coordinates
                assert(pixelCoords == texelBlockPair.second.getPixelLocation());
                printIndent(4, "\"coordinates\":{}[{}{},{}{},{}{}{}],{}", space, space,
                    pixelCoords.x, space, pixelCoords.y, space, pixelCoords.z, space, nl);

                const auto imageByteOffset = texelBlockPair.first.getTexelBlockByteOffset();
                // Currently we only compare matching formats, hence image byte offsets should match
                assert(imageByteOffset == texelBlockPair.second.getTexelBlockByteOffset());
                printIndent(4, "\"imageByteOffset\":{}[{}{},{}{}{}],{}", space, space,
                    imageByteOffset, space, imageByteOffset, space, nl);

                printIndent(4, "\"fileByteOffset\":{}[{}{},{}{}{}],{}", space, space,
                    formatOptionalFileOffset(diff.fileOffsets[0], imageByteOffset, true), space,
                    formatOptionalFileOffset(diff.fileOffsets[1], imageByteOffset, true), space, nl);

                printIndent(4, "\"packed\":{}[{}", space, nl);
                printIndent(5, "[{}{}{}],{}", space, formatPacked(texelBlockPair.first, true), space, nl);
                printIndent(5, "[{}{}{}]{}", space, formatPacked(texelBlockPair.second, true), space, nl);
                printIndent(4, "]");

                // Only output channels if not block-compressed
                if (!texelBlockPair.first.isBlockCompressed()) {
                    printIndent(0, ",{}", nl);
                    printIndent(4, "\"channels\":{}[{}", space, nl);
                    printIndent(5, "[{}{}{}],{}", space, formatChannels(texelBlockPair.first, true), space, nl);
                    printIndent(5, "[{}{}{}]{}", space, formatChannels(texelBlockPair.second, true), space, nl);
                    printIndent(4, "]");
                }

                printIndent(0, "{}", nl);
                printIndent(3, "}}");
            }
            if (diff.texelBlockPairList.empty()) {
                printIndent(0, "]");
            } else {
                printIndent(0, "{}", nl);
                printIndent(2, "]");
            }
        }
    }